

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPTransporter.h
# Opt level: O3

void __thiscall jaegertracing::utils::UDPTransporter::emitBatch(UDPTransporter *this,Batch *batch)

{
  element_type *peVar1;
  uint8_t *puVar2;
  AgentClient *pAVar3;
  ssize_t sVar4;
  logic_error *this_00;
  ostream *poVar5;
  system_error *this_01;
  int *piVar6;
  error_category *__ecat;
  int iVar7;
  ulong uVar8;
  ostringstream oss;
  string local_1c0;
  ostringstream local_1a0 [376];
  
  peVar1 = (this->_buffer).
           super___shared_ptr<apache::thrift::transport::TMemoryBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  puVar2 = peVar1->buffer_;
  (peVar1->
  super_TVirtualTransport<apache::thrift::transport::TMemoryBuffer,_apache::thrift::transport::TBufferBase>
  ).super_TBufferBase.rBase_ = puVar2;
  (peVar1->
  super_TVirtualTransport<apache::thrift::transport::TMemoryBuffer,_apache::thrift::transport::TBufferBase>
  ).super_TBufferBase.rBound_ = puVar2;
  (peVar1->
  super_TVirtualTransport<apache::thrift::transport::TMemoryBuffer,_apache::thrift::transport::TBufferBase>
  ).super_TBufferBase.wBase_ = puVar2;
  if (peVar1->owner_ == false) {
    (peVar1->
    super_TVirtualTransport<apache::thrift::transport::TMemoryBuffer,_apache::thrift::transport::TBufferBase>
    ).super_TBufferBase.wBound_ = puVar2;
    peVar1->bufferSize_ = 0;
  }
  pAVar3 = (this->_client)._M_t.
           super___uniq_ptr_impl<jaegertracing::agent::thrift::AgentClient,_std::default_delete<jaegertracing::agent::thrift::AgentClient>_>
           ._M_t.
           super__Tuple_impl<0UL,_jaegertracing::agent::thrift::AgentClient_*,_std::default_delete<jaegertracing::agent::thrift::AgentClient>_>
           .super__Head_base<0UL,_jaegertracing::agent::thrift::AgentClient_*,_false>._M_head_impl;
  (**(code **)(*(long *)pAVar3 + 0x18))(pAVar3,batch);
  peVar1 = (this->_buffer).
           super___shared_ptr<apache::thrift::transport::TMemoryBuffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  puVar2 = (peVar1->
           super_TVirtualTransport<apache::thrift::transport::TMemoryBuffer,_apache::thrift::transport::TBufferBase>
           ).super_TBufferBase.rBase_;
  uVar8 = (long)(peVar1->
                super_TVirtualTransport<apache::thrift::transport::TMemoryBuffer,_apache::thrift::transport::TBufferBase>
                ).super_TBufferBase.wBase_ - (long)puVar2;
  iVar7 = (int)uVar8;
  if (iVar7 <= (this->super_Transport)._maxPacketSize) {
    sVar4 = send((this->super_Transport)._socket._handle,puVar2,uVar8 & 0xffffffff,0);
    if (iVar7 == (int)sVar4) {
      return;
    }
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Failed to write message, numWritten=",0x24);
    poVar5 = std::ostream::_M_insert<long>((long)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,", size=",7);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    this_01 = (system_error *)__cxa_allocate_exception(0x20);
    piVar6 = __errno_location();
    iVar7 = *piVar6;
    std::__cxx11::stringbuf::str();
    __ecat = (error_category *)std::_V2::system_category();
    std::system_error::system_error(this_01,iVar7,__ecat,&local_1c0);
    __cxa_throw(this_01,&std::system_error::typeinfo,std::system_error::~system_error);
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Data does not fit within one UDP packet, size ",0x2e);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", max ",6);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(this->super_Transport)._maxPacketSize);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", spans ",8);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::logic_error::logic_error(this_00,(string *)&local_1c0);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void emitBatch(const thrift::Batch& batch) override
    {
        _buffer->resetBuffer();
        _client->emitBatch(batch);
        uint8_t* data = nullptr;
        uint32_t size = 0;
        _buffer->getBuffer(&data, &size);
        if (static_cast<int>(size) > _maxPacketSize) {
            std::ostringstream oss;
            oss << "Data does not fit within one UDP packet"
                   ", size "
                << size << ", max " << _maxPacketSize << ", spans "
                << batch.spans.size();
            throw std::logic_error(oss.str());
        }
        const auto numWritten = ::send(_socket.handle(), reinterpret_cast<char*>(data), sizeof(uint8_t) * size, 0);
        if (static_cast<unsigned>(numWritten) != size) {
            std::ostringstream oss;
            oss << "Failed to write message"
                   ", numWritten="
                << numWritten << ", size=" << size;
            throw std::system_error(errno, std::system_category(), oss.str());
        }
    }